

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O2

void Warning(char *message,char *badValueMessage,EWStatus type)

{
  bool bVar1;
  
  bVar1 = isInactiveTypeInCurrentPass(type);
  if (bVar1) {
    return;
  }
  WarningImpl((char *)0x0,message,badValueMessage,type);
  return;
}

Assistant:

void Warning(const char* message, const char* badValueMessage, EWStatus type) {
	if (isInactiveTypeInCurrentPass(type)) return;
	WarningImpl(nullptr, message, badValueMessage, type);
}